

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

type __thiscall obs::signal<int(int)>::operator()(signal<int(int)> *this,int *args)

{
  bool bVar1;
  int iVar2;
  slot<int_(int)> *this_00;
  iterator __end0;
  iterator __begin0;
  iterator local_70;
  iterator local_48;
  
  safe_list<obs::slot<int_(int)>_>::begin(&local_48,(safe_list<obs::slot<int_(int)>_> *)(this + 8));
  safe_list<obs::slot<int_(int)>_>::end(&local_70,(safe_list<obs::slot<int_(int)>_> *)(this + 8));
  iVar2 = 0;
  while( true ) {
    bVar1 = safe_list<obs::slot<int_(int)>_>::iterator::operator!=(&local_48,&local_70);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<int_(int)>_>::iterator::operator*(&local_48);
    if (this_00 != (slot<int_(int)> *)0x0) {
      iVar2 = slot<int(int)>::operator()((slot<int(int)> *)this_00,args);
    }
    safe_list<obs::slot<int_(int)>_>::iterator::operator++(&local_48);
  }
  safe_list<obs::slot<int_(int)>_>::iterator::~iterator(&local_70);
  safe_list<obs::slot<int_(int)>_>::iterator::~iterator(&local_48);
  return iVar2;
}

Assistant:

typename std::enable_if<!std::is_void<R>::value, R>::type
  operator()(Args2&&...args) {
    R result = R();
    for (auto slot : m_slots)
      if (slot)
        result = (*slot)(std::forward<Args2>(args)...);
    return result;
  }